

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

void __thiscall adios2::helper::CommImplMPI::~CommImplMPI(CommImplMPI *this)

{
  CommImpl *in_RDI;
  int flag;
  int local_c [3];
  
  in_RDI->_vptr_CommImpl = (_func_int **)&PTR__CommImplMPI_00229548;
  MPI_Finalized(local_c);
  if ((((local_c[0] == 0) && (in_RDI[1]._vptr_CommImpl != (_func_int **)&ompi_mpi_comm_null)) &&
      (in_RDI[1]._vptr_CommImpl != (_func_int **)&ompi_mpi_comm_world)) &&
     (in_RDI[1]._vptr_CommImpl != (_func_int **)&ompi_mpi_comm_self)) {
    MPI_Comm_free(in_RDI + 1);
  }
  adios2::helper::CommImpl::~CommImpl(in_RDI);
  return;
}

Assistant:

CommImplMPI::~CommImplMPI()
{
    // Handle the case where MPI is finalized before the ADIOS destructor is
    // called, which happens, e.g., with global / static ADIOS objects
    int flag;
    MPI_Finalized(&flag);
    if (!flag)
    {
        if (m_MPIComm != MPI_COMM_NULL && m_MPIComm != MPI_COMM_WORLD && m_MPIComm != MPI_COMM_SELF)
        {
            MPI_Comm_free(&m_MPIComm);
        }
    }
}